

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O0

Id dxil_spv::emit_atomic_access_chain
             (Impl *impl,ResourceMeta *meta,RawWidth width,Id image_id,Id coord,
             ComponentType *component_type)

{
  ComponentType CVar1;
  uint uVar2;
  Id IVar3;
  Builder *this;
  uint32_t local_bc;
  Id local_b8;
  Id local_b4;
  initializer_list<unsigned_int> local_b0;
  uint32_t local_9c;
  Id local_98;
  Id local_94;
  initializer_list<unsigned_int> local_90;
  Id local_7c;
  Id local_78;
  Id local_74;
  initializer_list<unsigned_int> local_70;
  Operation *local_60;
  Operation *ptr_bitcast_op;
  Id ptr_type_id;
  PhysicalPointerMeta physical_pointer_meta;
  Id uint_type;
  Id var_id;
  Operation *counter_ptr_op;
  Builder *builder;
  ComponentType *component_type_local;
  Id coord_local;
  Id image_id_local;
  RawWidth width_local;
  ResourceMeta *meta_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  CVar1 = raw_width_to_component_type(Integer,width);
  *component_type = CVar1;
  physical_pointer_meta.size = get_buffer_alias_handle(impl,meta,meta->var_id,Integer,width,V1);
  if (meta->storage == StorageClassPhysicalStorageBuffer) {
    uVar2 = raw_width_to_bits(width);
    physical_pointer_meta._4_4_ = spv::Builder::makeUintType(this,uVar2);
    ptr_bitcast_op._4_1_ = (meta->physical_pointer_meta).nonwritable;
    ptr_bitcast_op._5_1_ = (meta->physical_pointer_meta).nonreadable;
    ptr_bitcast_op._6_1_ = (meta->physical_pointer_meta).coherent;
    ptr_bitcast_op._7_1_ = (meta->physical_pointer_meta).rov;
    unique0x00012004 = (meta->physical_pointer_meta).stride;
    ptr_type_id._1_3_ = *(undefined3 *)&(meta->physical_pointer_meta).field_0x5;
    physical_pointer_meta._0_4_ = (meta->physical_pointer_meta).size;
    uVar2 = raw_width_to_bits(width);
    stack0xffffffffffffffac = CONCAT14((char)(uVar2 >> 3),ptr_bitcast_op._4_4_);
    ptr_bitcast_op._0_4_ =
         Converter::Impl::get_physical_pointer_block_type
                   (impl,physical_pointer_meta._4_4_,
                    (PhysicalPointerMeta *)((long)&ptr_bitcast_op + 4));
    local_60 = Converter::Impl::allocate(impl,OpBitcast,(Id)ptr_bitcast_op);
    Operation::add_id(local_60,image_id);
    Converter::Impl::add(impl,local_60,false);
    IVar3 = spv::Builder::makePointer
                      (this,StorageClassPhysicalStorageBuffer,physical_pointer_meta._4_4_);
    _uint_type = Converter::Impl::allocate(impl,OpAccessChain,IVar3);
    local_7c = local_60->id;
    local_78 = spv::Builder::makeUintConstant(this,0,false);
    local_70._M_array = &local_7c;
    local_70._M_len = 3;
    local_74 = coord;
    Operation::add_ids(_uint_type,&local_70);
  }
  else if (meta->storage == StorageClassStorageBuffer) {
    uVar2 = raw_width_to_bits(width);
    IVar3 = spv::Builder::makeUintType(this,uVar2);
    IVar3 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar3);
    _uint_type = Converter::Impl::allocate(impl,OpAccessChain,IVar3);
    local_9c = physical_pointer_meta.size;
    local_98 = spv::Builder::makeUintConstant(this,0,false);
    local_90._M_array = &local_9c;
    local_90._M_len = 3;
    local_94 = coord;
    Operation::add_ids(_uint_type,&local_90);
  }
  else {
    IVar3 = Converter::Impl::get_type_id(impl,meta->component_type,1,1,false);
    IVar3 = spv::Builder::makePointer(this,StorageClassImage,IVar3);
    _uint_type = Converter::Impl::allocate(impl,OpImageTexelPointer,IVar3);
    local_bc = physical_pointer_meta.size;
    local_b8 = coord;
    local_b4 = spv::Builder::makeUintConstant(this,0,false);
    local_b0._M_array = &local_bc;
    local_b0._M_len = 3;
    Operation::add_ids(_uint_type,&local_b0);
    *component_type = meta->component_type;
  }
  Converter::Impl::add(impl,_uint_type,false);
  return _uint_type->id;
}

Assistant:

spv::Id emit_atomic_access_chain(Converter::Impl &impl,
                                 const Converter::Impl::ResourceMeta &meta,
                                 RawWidth width, spv::Id image_id, spv::Id coord,
                                 DXIL::ComponentType &component_type)
{
	auto &builder = impl.builder();
	Operation *counter_ptr_op = nullptr;
	component_type = raw_width_to_component_type(RawType::Integer, width);
	spv::Id var_id = get_buffer_alias_handle(impl, meta, meta.var_id, RawType::Integer, width, RawVecSize::V1);
	if (meta.storage == spv::StorageClassPhysicalStorageBuffer)
	{
		spv::Id uint_type = builder.makeUintType(raw_width_to_bits(width));
		auto physical_pointer_meta = meta.physical_pointer_meta;
		physical_pointer_meta.stride = raw_width_to_bits(width) / 8;
		spv::Id ptr_type_id =
		    impl.get_physical_pointer_block_type(uint_type, physical_pointer_meta);

		auto *ptr_bitcast_op = impl.allocate(spv::OpBitcast, ptr_type_id);
		ptr_bitcast_op->add_id(image_id);
		impl.add(ptr_bitcast_op);

		counter_ptr_op = impl.allocate(spv::OpAccessChain,
		                               builder.makePointer(spv::StorageClassPhysicalStorageBuffer, uint_type));
		counter_ptr_op->add_ids({ ptr_bitcast_op->id, builder.makeUintConstant(0), coord });
	}
	else if (meta.storage == spv::StorageClassStorageBuffer)
	{
		counter_ptr_op =
		    impl.allocate(spv::OpAccessChain,
		                  builder.makePointer(spv::StorageClassStorageBuffer,
		                                      builder.makeUintType(raw_width_to_bits(width))));
		counter_ptr_op->add_ids({ var_id, builder.makeUintConstant(0), coord });
	}
	else
	{
		counter_ptr_op =
		    impl.allocate(spv::OpImageTexelPointer,
		                  builder.makePointer(spv::StorageClassImage, impl.get_type_id(meta.component_type, 1, 1)));
		counter_ptr_op->add_ids({ var_id, coord, builder.makeUintConstant(0) });
		component_type = meta.component_type;
	}
	impl.add(counter_ptr_op);

	return counter_ptr_op->id;
}